

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_inv_txfm_avx2.c
# Opt level: O3

void idct32_stage9_avx2(__m256i *bf1,__m256i *out,int do_cols,int bd,int out_shift,__m256i *clamp_lo
                       ,__m256i *clamp_hi)

{
  undefined1 auVar1 [32];
  undefined1 auVar2 [32];
  undefined1 auVar3 [32];
  __m256i alVar4;
  __m256i alVar5;
  __m256i alVar6;
  __m256i alVar7;
  __m256i alVar8;
  __m256i alVar9;
  __m256i alVar10;
  __m256i alVar11;
  __m256i alVar12;
  __m256i alVar13;
  __m256i alVar14;
  __m256i alVar15;
  __m256i alVar16;
  __m256i alVar17;
  __m256i alVar18;
  __m256i alVar19;
  __m256i alVar20;
  __m256i alVar21;
  __m256i alVar22;
  __m256i alVar23;
  __m256i alVar24;
  __m256i alVar25;
  __m256i alVar26;
  undefined1 auVar27 [32];
  int iVar28;
  undefined1 auVar29 [16];
  undefined1 auVar30 [32];
  __m256i clamp_hi_out;
  __m256i clamp_lo_out;
  int local_80;
  int iStack_7c;
  int iStack_78;
  int iStack_74;
  int iStack_70;
  int iStack_6c;
  int iStack_68;
  int iStack_64;
  int local_60;
  int iStack_5c;
  int iStack_58;
  int iStack_54;
  int iStack_50;
  int iStack_4c;
  int iStack_48;
  int iStack_44;
  
  auVar1 = vpaddd_avx2((undefined1  [32])bf1[0x1f],(undefined1  [32])*bf1);
  auVar27 = vpsubd_avx2((undefined1  [32])*bf1,(undefined1  [32])bf1[0x1f]);
  auVar1 = vpmaxsd_avx2(auVar1,(undefined1  [32])*clamp_lo);
  alVar4 = (__m256i)vpminsd_avx2(auVar1,(undefined1  [32])*clamp_hi);
  auVar1 = vpmaxsd_avx2(auVar27,(undefined1  [32])*clamp_lo);
  alVar5 = (__m256i)vpminsd_avx2(auVar1,(undefined1  [32])*clamp_hi);
  *out = alVar4;
  out[0x1f] = alVar5;
  auVar1 = vpaddd_avx2((undefined1  [32])bf1[0x1e],(undefined1  [32])bf1[1]);
  auVar27 = vpsubd_avx2((undefined1  [32])bf1[1],(undefined1  [32])bf1[0x1e]);
  auVar1 = vpmaxsd_avx2(auVar1,(undefined1  [32])*clamp_lo);
  alVar5 = (__m256i)vpminsd_avx2(auVar1,(undefined1  [32])*clamp_hi);
  auVar1 = vpmaxsd_avx2(auVar27,(undefined1  [32])*clamp_lo);
  alVar6 = (__m256i)vpminsd_avx2(auVar1,(undefined1  [32])*clamp_hi);
  out[1] = alVar5;
  out[0x1e] = alVar6;
  auVar1 = vpaddd_avx2((undefined1  [32])bf1[0x1d],(undefined1  [32])bf1[2]);
  auVar27 = vpsubd_avx2((undefined1  [32])bf1[2],(undefined1  [32])bf1[0x1d]);
  auVar1 = vpmaxsd_avx2(auVar1,(undefined1  [32])*clamp_lo);
  alVar6 = (__m256i)vpminsd_avx2(auVar1,(undefined1  [32])*clamp_hi);
  auVar1 = vpmaxsd_avx2(auVar27,(undefined1  [32])*clamp_lo);
  alVar7 = (__m256i)vpminsd_avx2(auVar1,(undefined1  [32])*clamp_hi);
  out[2] = alVar6;
  out[0x1d] = alVar7;
  auVar1 = vpaddd_avx2((undefined1  [32])bf1[0x1c],(undefined1  [32])bf1[3]);
  auVar27 = vpsubd_avx2((undefined1  [32])bf1[3],(undefined1  [32])bf1[0x1c]);
  auVar1 = vpmaxsd_avx2(auVar1,(undefined1  [32])*clamp_lo);
  alVar7 = (__m256i)vpminsd_avx2(auVar1,(undefined1  [32])*clamp_hi);
  auVar1 = vpmaxsd_avx2(auVar27,(undefined1  [32])*clamp_lo);
  alVar8 = (__m256i)vpminsd_avx2(auVar1,(undefined1  [32])*clamp_hi);
  out[3] = alVar7;
  out[0x1c] = alVar8;
  auVar1 = vpaddd_avx2((undefined1  [32])bf1[0x1b],(undefined1  [32])bf1[4]);
  auVar27 = vpsubd_avx2((undefined1  [32])bf1[4],(undefined1  [32])bf1[0x1b]);
  auVar1 = vpmaxsd_avx2(auVar1,(undefined1  [32])*clamp_lo);
  alVar8 = (__m256i)vpminsd_avx2(auVar1,(undefined1  [32])*clamp_hi);
  auVar1 = vpmaxsd_avx2(auVar27,(undefined1  [32])*clamp_lo);
  alVar9 = (__m256i)vpminsd_avx2(auVar1,(undefined1  [32])*clamp_hi);
  out[4] = alVar8;
  out[0x1b] = alVar9;
  auVar1 = vpaddd_avx2((undefined1  [32])bf1[0x1a],(undefined1  [32])bf1[5]);
  auVar27 = vpsubd_avx2((undefined1  [32])bf1[5],(undefined1  [32])bf1[0x1a]);
  auVar1 = vpmaxsd_avx2(auVar1,(undefined1  [32])*clamp_lo);
  alVar9 = (__m256i)vpminsd_avx2(auVar1,(undefined1  [32])*clamp_hi);
  auVar1 = vpmaxsd_avx2(auVar27,(undefined1  [32])*clamp_lo);
  alVar10 = (__m256i)vpminsd_avx2(auVar1,(undefined1  [32])*clamp_hi);
  out[5] = alVar9;
  out[0x1a] = alVar10;
  auVar1 = vpaddd_avx2((undefined1  [32])bf1[0x19],(undefined1  [32])bf1[6]);
  auVar27 = vpsubd_avx2((undefined1  [32])bf1[6],(undefined1  [32])bf1[0x19]);
  auVar1 = vpmaxsd_avx2(auVar1,(undefined1  [32])*clamp_lo);
  alVar10 = (__m256i)vpminsd_avx2(auVar1,(undefined1  [32])*clamp_hi);
  auVar1 = vpmaxsd_avx2(auVar27,(undefined1  [32])*clamp_lo);
  alVar11 = (__m256i)vpminsd_avx2(auVar1,(undefined1  [32])*clamp_hi);
  out[6] = alVar10;
  out[0x19] = alVar11;
  auVar1 = vpaddd_avx2((undefined1  [32])bf1[0x18],(undefined1  [32])bf1[7]);
  auVar27 = vpsubd_avx2((undefined1  [32])bf1[7],(undefined1  [32])bf1[0x18]);
  auVar1 = vpmaxsd_avx2(auVar1,(undefined1  [32])*clamp_lo);
  alVar11 = (__m256i)vpminsd_avx2(auVar1,(undefined1  [32])*clamp_hi);
  auVar1 = vpmaxsd_avx2(auVar27,(undefined1  [32])*clamp_lo);
  alVar12 = (__m256i)vpminsd_avx2(auVar1,(undefined1  [32])*clamp_hi);
  out[7] = alVar11;
  out[0x18] = alVar12;
  auVar1 = vpaddd_avx2((undefined1  [32])bf1[0x17],(undefined1  [32])bf1[8]);
  auVar27 = vpsubd_avx2((undefined1  [32])bf1[8],(undefined1  [32])bf1[0x17]);
  auVar1 = vpmaxsd_avx2(auVar1,(undefined1  [32])*clamp_lo);
  alVar12 = (__m256i)vpminsd_avx2(auVar1,(undefined1  [32])*clamp_hi);
  auVar1 = vpmaxsd_avx2(auVar27,(undefined1  [32])*clamp_lo);
  alVar13 = (__m256i)vpminsd_avx2(auVar1,(undefined1  [32])*clamp_hi);
  out[8] = alVar12;
  out[0x17] = alVar13;
  auVar1 = vpaddd_avx2((undefined1  [32])bf1[0x16],(undefined1  [32])bf1[9]);
  auVar27 = vpsubd_avx2((undefined1  [32])bf1[9],(undefined1  [32])bf1[0x16]);
  auVar1 = vpmaxsd_avx2(auVar1,(undefined1  [32])*clamp_lo);
  alVar13 = (__m256i)vpminsd_avx2(auVar1,(undefined1  [32])*clamp_hi);
  auVar1 = vpmaxsd_avx2(auVar27,(undefined1  [32])*clamp_lo);
  alVar14 = (__m256i)vpminsd_avx2(auVar1,(undefined1  [32])*clamp_hi);
  out[9] = alVar13;
  out[0x16] = alVar14;
  auVar1 = vpaddd_avx2((undefined1  [32])bf1[0x15],(undefined1  [32])bf1[10]);
  auVar27 = vpsubd_avx2((undefined1  [32])bf1[10],(undefined1  [32])bf1[0x15]);
  auVar1 = vpmaxsd_avx2(auVar1,(undefined1  [32])*clamp_lo);
  alVar15 = (__m256i)vpminsd_avx2(auVar1,(undefined1  [32])*clamp_hi);
  auVar1 = vpmaxsd_avx2(auVar27,(undefined1  [32])*clamp_lo);
  alVar16 = (__m256i)vpminsd_avx2(auVar1,(undefined1  [32])*clamp_hi);
  out[10] = alVar15;
  out[0x15] = alVar16;
  auVar1 = vpaddd_avx2((undefined1  [32])bf1[0x14],(undefined1  [32])bf1[0xb]);
  auVar27 = vpsubd_avx2((undefined1  [32])bf1[0xb],(undefined1  [32])bf1[0x14]);
  auVar1 = vpmaxsd_avx2(auVar1,(undefined1  [32])*clamp_lo);
  auVar27 = vpmaxsd_avx2(auVar27,(undefined1  [32])*clamp_lo);
  alVar17 = (__m256i)vpminsd_avx2(auVar1,(undefined1  [32])*clamp_hi);
  alVar18 = (__m256i)vpminsd_avx2(auVar27,(undefined1  [32])*clamp_hi);
  out[0xb] = alVar17;
  out[0x14] = alVar18;
  auVar1 = vpaddd_avx2((undefined1  [32])bf1[0x13],(undefined1  [32])bf1[0xc]);
  auVar27 = vpsubd_avx2((undefined1  [32])bf1[0xc],(undefined1  [32])bf1[0x13]);
  auVar1 = vpmaxsd_avx2(auVar1,(undefined1  [32])*clamp_lo);
  auVar27 = vpmaxsd_avx2(auVar27,(undefined1  [32])*clamp_lo);
  alVar19 = (__m256i)vpminsd_avx2(auVar1,(undefined1  [32])*clamp_hi);
  alVar20 = (__m256i)vpminsd_avx2(auVar27,(undefined1  [32])*clamp_hi);
  out[0xc] = alVar19;
  out[0x13] = alVar20;
  auVar1 = vpaddd_avx2((undefined1  [32])bf1[0x12],(undefined1  [32])bf1[0xd]);
  auVar27 = vpsubd_avx2((undefined1  [32])bf1[0xd],(undefined1  [32])bf1[0x12]);
  auVar1 = vpmaxsd_avx2(auVar1,(undefined1  [32])*clamp_lo);
  auVar27 = vpmaxsd_avx2(auVar27,(undefined1  [32])*clamp_lo);
  alVar21 = (__m256i)vpminsd_avx2(auVar1,(undefined1  [32])*clamp_hi);
  alVar22 = (__m256i)vpminsd_avx2(auVar27,(undefined1  [32])*clamp_hi);
  out[0xd] = alVar21;
  out[0x12] = alVar22;
  auVar1 = vpaddd_avx2((undefined1  [32])bf1[0x11],(undefined1  [32])bf1[0xe]);
  auVar27 = vpsubd_avx2((undefined1  [32])bf1[0xe],(undefined1  [32])bf1[0x11]);
  auVar1 = vpmaxsd_avx2(auVar1,(undefined1  [32])*clamp_lo);
  auVar27 = vpmaxsd_avx2(auVar27,(undefined1  [32])*clamp_lo);
  alVar23 = (__m256i)vpminsd_avx2(auVar1,(undefined1  [32])*clamp_hi);
  alVar24 = (__m256i)vpminsd_avx2(auVar27,(undefined1  [32])*clamp_hi);
  out[0xe] = alVar23;
  out[0x11] = alVar24;
  auVar1 = vpaddd_avx2((undefined1  [32])bf1[0x10],(undefined1  [32])bf1[0xf]);
  auVar27 = vpsubd_avx2((undefined1  [32])bf1[0xf],(undefined1  [32])bf1[0x10]);
  auVar1 = vpmaxsd_avx2(auVar1,(undefined1  [32])*clamp_lo);
  auVar27 = vpmaxsd_avx2(auVar27,(undefined1  [32])*clamp_lo);
  alVar25 = (__m256i)vpminsd_avx2(auVar1,(undefined1  [32])*clamp_hi);
  alVar26 = (__m256i)vpminsd_avx2(auVar27,(undefined1  [32])*clamp_hi);
  out[0xf] = alVar25;
  out[0x10] = alVar26;
  if (do_cols == 0) {
    iVar28 = 10;
    if (10 < bd) {
      iVar28 = bd;
    }
    local_80 = 0x20 << ((byte)iVar28 & 0x1f);
    local_60 = -local_80;
    local_80 = local_80 + -1;
    if (out_shift != 0) {
      iVar28 = 1 << ((char)out_shift - 1U & 0x1f);
      auVar30._4_4_ = iVar28;
      auVar30._0_4_ = iVar28;
      auVar30._8_4_ = iVar28;
      auVar30._12_4_ = iVar28;
      auVar30._16_4_ = iVar28;
      auVar30._20_4_ = iVar28;
      auVar30._24_4_ = iVar28;
      auVar30._28_4_ = iVar28;
      auVar1 = vpaddd_avx2(auVar30,(undefined1  [32])alVar4);
      alVar4 = (__m256i)vpsrad_avx2(auVar1,ZEXT416((uint)out_shift));
      *out = alVar4;
      auVar1 = vpaddd_avx2(auVar30,(undefined1  [32])alVar5);
      alVar4 = (__m256i)vpsrad_avx2(auVar1,ZEXT416((uint)out_shift));
      out[1] = alVar4;
      auVar1 = vpaddd_avx2((undefined1  [32])alVar6,auVar30);
      auVar29 = ZEXT416((uint)out_shift);
      alVar4 = (__m256i)vpsrad_avx2(auVar1,auVar29);
      out[2] = alVar4;
      auVar1 = vpaddd_avx2(auVar30,(undefined1  [32])alVar7);
      alVar4 = (__m256i)vpsrad_avx2(auVar1,auVar29);
      out[3] = alVar4;
      auVar1 = vpaddd_avx2((undefined1  [32])alVar8,auVar30);
      alVar4 = (__m256i)vpsrad_avx2(auVar1,auVar29);
      out[4] = alVar4;
      auVar1 = vpaddd_avx2((undefined1  [32])alVar9,auVar30);
      alVar4 = (__m256i)vpsrad_avx2(auVar1,auVar29);
      out[5] = alVar4;
      auVar1 = vpaddd_avx2((undefined1  [32])alVar10,auVar30);
      auVar29 = ZEXT416((uint)out_shift);
      alVar4 = (__m256i)vpsrad_avx2(auVar1,auVar29);
      out[6] = alVar4;
      auVar1 = vpaddd_avx2(auVar30,(undefined1  [32])alVar11);
      alVar4 = (__m256i)vpsrad_avx2(auVar1,auVar29);
      out[7] = alVar4;
      auVar1 = vpaddd_avx2(auVar30,(undefined1  [32])alVar12);
      alVar4 = (__m256i)vpsrad_avx2(auVar1,auVar29);
      out[8] = alVar4;
      auVar1 = vpaddd_avx2(auVar30,(undefined1  [32])alVar13);
      alVar4 = (__m256i)vpsrad_avx2(auVar1,auVar29);
      out[9] = alVar4;
      auVar1 = vpaddd_avx2(auVar30,(undefined1  [32])alVar15);
      alVar4 = (__m256i)vpsrad_avx2(auVar1,auVar29);
      out[10] = alVar4;
      auVar1 = vpaddd_avx2(auVar30,(undefined1  [32])alVar17);
      alVar4 = (__m256i)vpsrad_avx2(auVar1,auVar29);
      out[0xb] = alVar4;
      auVar1 = vpaddd_avx2(auVar30,(undefined1  [32])alVar19);
      alVar4 = (__m256i)vpsrad_avx2(auVar1,auVar29);
      out[0xc] = alVar4;
      auVar1 = vpaddd_avx2(auVar30,(undefined1  [32])alVar21);
      alVar4 = (__m256i)vpsrad_avx2(auVar1,auVar29);
      out[0xd] = alVar4;
      auVar1 = vpaddd_avx2((undefined1  [32])alVar23,auVar30);
      auVar29 = ZEXT416((uint)out_shift);
      alVar4 = (__m256i)vpsrad_avx2(auVar1,auVar29);
      out[0xe] = alVar4;
      auVar1 = vpaddd_avx2((undefined1  [32])alVar25,auVar30);
      alVar4 = (__m256i)vpsrad_avx2(auVar1,auVar29);
      out[0xf] = alVar4;
      auVar1 = vpaddd_avx2((undefined1  [32])alVar26,auVar30);
      alVar4 = (__m256i)vpsrad_avx2(auVar1,auVar29);
      out[0x10] = alVar4;
      auVar1 = vpaddd_avx2((undefined1  [32])alVar24,auVar30);
      alVar4 = (__m256i)vpsrad_avx2(auVar1,auVar29);
      out[0x11] = alVar4;
      auVar1 = vpaddd_avx2(auVar30,(undefined1  [32])alVar22);
      alVar4 = (__m256i)vpsrad_avx2(auVar1,auVar29);
      out[0x12] = alVar4;
      auVar1 = vpaddd_avx2(auVar30,(undefined1  [32])alVar20);
      alVar4 = (__m256i)vpsrad_avx2(auVar1,auVar29);
      out[0x13] = alVar4;
      auVar1 = vpaddd_avx2(auVar30,(undefined1  [32])alVar18);
      auVar27 = vpaddd_avx2(auVar30,(undefined1  [32])alVar16);
      auVar2 = vpaddd_avx2(auVar30,(undefined1  [32])alVar14);
      auVar3 = vpaddd_avx2(auVar30,(undefined1  [32])out[0x17]);
      alVar4 = (__m256i)vpsrad_avx2(auVar1,auVar29);
      alVar5 = (__m256i)vpsrad_avx2(auVar27,auVar29);
      out[0x14] = alVar4;
      out[0x15] = alVar5;
      alVar4 = (__m256i)vpsrad_avx2(auVar2,auVar29);
      out[0x16] = alVar4;
      alVar4 = (__m256i)vpsrad_avx2(auVar3,auVar29);
      out[0x17] = alVar4;
      auVar1 = vpaddd_avx2(auVar30,(undefined1  [32])out[0x18]);
      auVar27 = vpaddd_avx2(auVar30,(undefined1  [32])out[0x19]);
      auVar2 = vpaddd_avx2(auVar30,(undefined1  [32])out[0x1a]);
      auVar3 = vpaddd_avx2(auVar30,(undefined1  [32])out[0x1b]);
      alVar4 = (__m256i)vpsrad_avx2(auVar1,auVar29);
      alVar5 = (__m256i)vpsrad_avx2(auVar27,auVar29);
      out[0x18] = alVar4;
      out[0x19] = alVar5;
      alVar4 = (__m256i)vpsrad_avx2(auVar2,auVar29);
      out[0x1a] = alVar4;
      alVar4 = (__m256i)vpsrad_avx2(auVar3,auVar29);
      out[0x1b] = alVar4;
      auVar1 = vpaddd_avx2(auVar30,(undefined1  [32])out[0x1c]);
      auVar27 = vpaddd_avx2(auVar30,(undefined1  [32])out[0x1d]);
      auVar2 = vpaddd_avx2(auVar30,(undefined1  [32])out[0x1e]);
      auVar3 = vpaddd_avx2(auVar30,(undefined1  [32])out[0x1f]);
      alVar4 = (__m256i)vpsrad_avx2(auVar1,auVar29);
      alVar5 = (__m256i)vpsrad_avx2(auVar27,auVar29);
      out[0x1c] = alVar4;
      out[0x1d] = alVar5;
      alVar4 = (__m256i)vpsrad_avx2(auVar2,ZEXT416((uint)out_shift));
      out[0x1e] = alVar4;
      alVar4 = (__m256i)vpsrad_avx2(auVar3,ZEXT416((uint)out_shift));
      out[0x1f] = alVar4;
    }
    iStack_7c = local_80;
    iStack_78 = local_80;
    iStack_74 = local_80;
    iStack_70 = local_80;
    iStack_6c = local_80;
    iStack_68 = local_80;
    iStack_64 = local_80;
    iStack_5c = local_60;
    iStack_58 = local_60;
    iStack_54 = local_60;
    iStack_50 = local_60;
    iStack_4c = local_60;
    iStack_48 = local_60;
    iStack_44 = local_60;
    highbd_clamp_epi32_avx2(out,out,(__m256i *)&local_60,(__m256i *)&local_80,0x20);
  }
  return;
}

Assistant:

static inline void idct32_stage9_avx2(__m256i *bf1, __m256i *out,
                                      const int do_cols, const int bd,
                                      const int out_shift,
                                      const __m256i *clamp_lo,
                                      const __m256i *clamp_hi) {
  addsub_avx2(bf1[0], bf1[31], out + 0, out + 31, clamp_lo, clamp_hi);
  addsub_avx2(bf1[1], bf1[30], out + 1, out + 30, clamp_lo, clamp_hi);
  addsub_avx2(bf1[2], bf1[29], out + 2, out + 29, clamp_lo, clamp_hi);
  addsub_avx2(bf1[3], bf1[28], out + 3, out + 28, clamp_lo, clamp_hi);
  addsub_avx2(bf1[4], bf1[27], out + 4, out + 27, clamp_lo, clamp_hi);
  addsub_avx2(bf1[5], bf1[26], out + 5, out + 26, clamp_lo, clamp_hi);
  addsub_avx2(bf1[6], bf1[25], out + 6, out + 25, clamp_lo, clamp_hi);
  addsub_avx2(bf1[7], bf1[24], out + 7, out + 24, clamp_lo, clamp_hi);
  addsub_avx2(bf1[8], bf1[23], out + 8, out + 23, clamp_lo, clamp_hi);
  addsub_avx2(bf1[9], bf1[22], out + 9, out + 22, clamp_lo, clamp_hi);
  addsub_avx2(bf1[10], bf1[21], out + 10, out + 21, clamp_lo, clamp_hi);
  addsub_avx2(bf1[11], bf1[20], out + 11, out + 20, clamp_lo, clamp_hi);
  addsub_avx2(bf1[12], bf1[19], out + 12, out + 19, clamp_lo, clamp_hi);
  addsub_avx2(bf1[13], bf1[18], out + 13, out + 18, clamp_lo, clamp_hi);
  addsub_avx2(bf1[14], bf1[17], out + 14, out + 17, clamp_lo, clamp_hi);
  addsub_avx2(bf1[15], bf1[16], out + 15, out + 16, clamp_lo, clamp_hi);
  if (!do_cols) {
    const int log_range_out = AOMMAX(16, bd + 6);
    const __m256i clamp_lo_out = _mm256_set1_epi32(-(1 << (log_range_out - 1)));
    const __m256i clamp_hi_out =
        _mm256_set1_epi32((1 << (log_range_out - 1)) - 1);
    round_shift_8x8_avx2(out, out_shift);
    round_shift_8x8_avx2(out + 16, out_shift);
    highbd_clamp_epi32_avx2(out, out, &clamp_lo_out, &clamp_hi_out, 32);
  }
}